

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_iTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  size_t __size;
  uchar uVar1;
  size_t sVar2;
  char *key;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *__ptr;
  size_t allocsize;
  ucvector decoded;
  ucvector local_68;
  char *local_50;
  ulong local_48;
  LodePNGInfo *local_40;
  LodePNGDecompressSettings *local_38;
  
  local_68.data = (uchar *)0x0;
  local_68.size = 0;
  local_68.allocsize = 0;
  if (chunkLength < 5) {
    uVar7 = 0x1e;
LAB_00111086:
    key = (char *)0x0;
  }
  else {
    uVar7 = 1;
    uVar4 = 0;
    do {
      if (data[uVar4] == '\0') break;
      uVar4 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar4 < chunkLength);
    uVar8 = uVar7 - 1;
    uVar5 = uVar7 + 2;
    uVar6 = (ulong)uVar5;
    if (chunkLength <= uVar6) {
      uVar7 = 0x4b;
      goto LAB_00111086;
    }
    if (uVar7 - 0x51 < 0xffffffb1) {
      uVar7 = 0x59;
      goto LAB_00111086;
    }
    __size = (ulong)uVar8 + 1;
    local_40 = info;
    local_38 = zlibsettings;
    key = (char *)malloc(__size);
    if (key == (char *)0x0) {
      key = (char *)0x0;
LAB_00111127:
      pcVar3 = (char *)0x0;
      uVar7 = 0x53;
      __ptr = (char *)0x0;
      goto LAB_0011108e;
    }
    key[uVar4] = '\0';
    if (uVar8 != 0) {
      memcpy(key,data,(ulong)uVar8);
    }
    uVar9 = 0;
    if (data[uVar4 + 2] == '\0') {
      if (uVar6 < chunkLength) {
        uVar9 = 0;
        do {
          if (data[uVar6] == '\0') break;
          uVar6 = (ulong)(uVar7 + 3 + uVar9);
          uVar9 = uVar9 + 1;
        } while (uVar6 < chunkLength);
      }
      uVar1 = data[__size];
      pcVar3 = (char *)malloc((ulong)(uVar9 + 1));
      if (pcVar3 != (char *)0x0) {
        pcVar3[uVar9] = '\0';
        if (uVar9 != 0) {
          uVar4 = 0;
          do {
            pcVar3[uVar4] = data[uVar5 + (int)uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar9 != uVar4);
        }
        uVar5 = uVar9 + 1 + uVar5;
        uVar4 = (ulong)uVar5;
        uVar7 = 0;
        if (uVar4 < chunkLength) {
          uVar7 = 0;
          do {
            if (data[uVar4] == '\0') break;
            uVar4 = (ulong)(uVar8 + uVar9 + 5 + uVar7);
            uVar7 = uVar7 + 1;
          } while (uVar4 < chunkLength);
        }
        local_48 = (ulong)(uVar7 + 1);
        local_50 = pcVar3;
        pcVar3 = (char *)malloc(local_48);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = (char *)0x0;
LAB_00111268:
          uVar7 = 0x53;
          __ptr = local_50;
        }
        else {
          pcVar3[uVar7] = '\0';
          if (uVar7 != 0) {
            uVar4 = 0;
            do {
              pcVar3[uVar4] = data[uVar5 + (int)uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar7 != uVar4);
          }
          uVar6 = (ulong)((int)local_48 + uVar5);
          uVar4 = 0;
          if (uVar6 <= chunkLength) {
            uVar4 = chunkLength - uVar6;
          }
          if (uVar1 == '\0') {
            uVar6 = (ulong)((int)uVar4 + 1);
            uVar5 = ucvector_reserve(&local_68,uVar6);
            if (uVar5 == 0) goto LAB_00111268;
            local_68.data[uVar4 & 0xffffffff] = '\0';
            local_68.size = uVar6;
            if ((uVar4 & 0xffffffff) != 0) {
              uVar6 = 0;
              do {
                local_68.data[uVar6] = data[uVar8 + uVar7 + uVar9 + 5 + (int)uVar6];
                uVar6 = uVar6 + 1;
              } while ((uVar4 & 0xffffffff) != uVar6);
            }
          }
          else {
            uVar7 = zlib_decompress(&local_68.data,&local_68.size,data + uVar6,uVar4 & 0xffffffff,
                                    local_38);
            sVar2 = local_68.size;
            __ptr = local_50;
            if (uVar7 != 0) goto LAB_0011108e;
            if (local_68.allocsize < local_68.size) {
              local_68.allocsize = local_68.size;
            }
            allocsize = local_68.size + 1;
            uVar7 = ucvector_reserve(&local_68,allocsize);
            if (uVar7 != 0) {
              local_68.data[sVar2] = '\0';
              local_68.size = allocsize;
            }
          }
          __ptr = local_50;
          uVar7 = lodepng_add_itext(local_40,key,local_50,pcVar3,(char *)local_68.data);
        }
        goto LAB_0011108e;
      }
      goto LAB_00111127;
    }
    uVar7 = 0x48;
  }
  pcVar3 = (char *)0x0;
  __ptr = (char *)0x0;
LAB_0011108e:
  free(key);
  free(__ptr);
  free(pcVar3);
  local_68.size = 0;
  local_68.allocsize = 0;
  free(local_68.data);
  return uVar7;
}

Assistant:

static void ucvector_init(ucvector* p)
{
  p->data = NULL;
  p->size = p->allocsize = 0;
}